

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1899::TestCase1899(TestCase1899 *this)

{
  TestCase1899 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x76b,"legacy test: Encoding/UnionInGenerics");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c1458;
  return;
}

Assistant:

TEST(Encoding, UnionInGenerics) {
  MallocMessageBuilder message;
  auto builder = message.initRoot<test::TestGenerics<>>();
  auto reader = builder.asReader();

  //just call the methods to verify that generated code compiles
  reader.which();
  builder.which();

  reader.isUv();
  builder.isUv();
  reader.getUv();
  builder.getUv();
  builder.setUv();

  builder.initUg();

  reader.isUg();
  builder.isUg();
  reader.getUg();
  builder.getUg();
  builder.initUg();
}